

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

AST * __thiscall jsonnet::internal::anon_unknown_0::Interpreter::joinStrings(Interpreter *this)

{
  pointer pFVar1;
  HeapEntity *pHVar2;
  HeapEntity *context;
  _func_int **pp_Var3;
  uint uVar4;
  ulong uVar5;
  Value VVar6;
  
  pFVar1 = (this->stack).stack.
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Frame,_std::allocator<jsonnet::internal::(anonymous_namespace)::Frame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pHVar2 = pFVar1[-1].val2.v.h;
  uVar5 = (ulong)pFVar1[-1].elementId;
  pp_Var3 = pHVar2[1]._vptr_HeapEntity;
  if (uVar5 < (ulong)(*(long *)&pHVar2[1].mark - (long)pp_Var3 >> 3)) {
    do {
      context = (HeapEntity *)pp_Var3[uVar5];
      if (context->field_0xa == '\0') {
        Stack::newCall(&this->stack,&pFVar1[-1].location,context,*(HeapObject **)&context[5].mark,
                       *(uint *)&context[6]._vptr_HeapEntity,(BindingFrame *)&context[2].mark);
        return *(AST **)&context[6].mark;
      }
      joinString(this,&pFVar1[-1].first,&pFVar1[-1].str,(Value *)pFVar1[-1].val.v.h,(uint)uVar5,
                 (Value *)(context + 1));
      uVar4 = pFVar1[-1].elementId + 1;
      uVar5 = (ulong)uVar4;
      pFVar1[-1].elementId = uVar4;
      pp_Var3 = pHVar2[1]._vptr_HeapEntity;
    } while (uVar5 < (ulong)(*(long *)&pHVar2[1].mark - (long)pp_Var3 >> 3));
  }
  VVar6 = makeString(this,(UString *)pFVar1[-1].str._M_dataplus._M_p);
  (this->scratch).t = STRING;
  (this->scratch).v = VVar6._0_8_;
  return (AST *)0x0;
}

Assistant:

const AST *joinStrings(void)
    {
        Frame &f = stack.top();
        const auto& elements = static_cast<HeapArray*>(f.val2.v.h)->elements;
        while (f.elementId < elements.size()) {
            auto *th = elements[f.elementId];
            if (th->filled) {
                joinString(f.first, f.str, f.val, f.elementId, th->content);
                f.elementId++;
            } else {
                stack.newCall(f.location, th, th->self, th->offset, th->upValues);
                return th->body;
            }
        }
        scratch = makeString(f.str);
        return nullptr;
    }